

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

char * absl::StackString(void **pcs,int n,char *buf,int maxlen,bool symbolize)

{
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  ulong uVar5;
  char sym [200];
  undefined1 local_f8 [200];
  
  if (n != 0) {
    uVar5 = 0;
    iVar4 = 0;
    do {
      if (symbolize) {
        cVar1 = (*(code *)(anonymous_namespace)::symbolizer)(pcs[uVar5],local_f8,200);
        if (cVar1 == '\0') {
          local_f8[0] = 0;
        }
        pcVar3 = "";
        if (uVar5 == 0) {
          pcVar3 = "\n";
        }
        snprintf(buf + iVar4,(long)(maxlen - iVar4),"%s\t@ %p %s\n",pcVar3,pcs[uVar5],local_f8);
      }
      else {
        snprintf(buf + iVar4,(long)(maxlen - iVar4)," %p",pcs[uVar5]);
      }
      sVar2 = strlen(buf + iVar4);
      iVar4 = iVar4 + (int)sVar2;
      uVar5 = uVar5 + 1;
    } while ((uint)n != uVar5);
  }
  return buf;
}

Assistant:

static char *StackString(void **pcs, int n, char *buf, int maxlen,
                         bool symbolize) {
  static const int kSymLen = 200;
  char sym[kSymLen];
  int len = 0;
  for (int i = 0; i != n; i++) {
    if (symbolize) {
      if (!symbolizer(pcs[i], sym, kSymLen)) {
        sym[0] = '\0';
      }
      snprintf(buf + len, maxlen - len, "%s\t@ %p %s\n",
               (i == 0 ? "\n" : ""),
               pcs[i], sym);
    } else {
      snprintf(buf + len, maxlen - len, " %p", pcs[i]);
    }
    len += strlen(&buf[len]);
  }
  return buf;
}